

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointRecord1.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::PointRecord1::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,PointRecord1 *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  EnvironmentRecord::GetAsString_abi_cxx11_(&local_1c0,&this->super_EnvironmentRecord);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\tLocation: ");
  WorldCoordinates::GetAsString_abi_cxx11_(&local_1e0,&this->m_Location);
  std::operator<<(poVar1,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString PointRecord1::GetAsString() const
{
    KStringStream ss;

    ss << EnvironmentRecord::GetAsString()
       << "\tLocation: " <<  m_Location.GetAsString();

    return ss.str();
}